

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O0

void __thiscall
Transaction_RollbackAfterFillingRegion_Test::TestBody
          (Transaction_RollbackAfterFillingRegion_Test *this)

{
  bool bVar1;
  int iVar2;
  storage *psVar3;
  region_container *this_00;
  file_base *pfVar4;
  __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01
  ;
  element_type *this_02;
  uint64_t uVar5;
  uint64_t uVar6;
  Message *pMVar7;
  char *pcVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mock_database *this_03;
  AssertHelper local_160;
  Message local_158;
  unsigned_long local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_2;
  Message local_130;
  size_type local_128;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_1;
  unique_lock<mock_mutex> local_108;
  undefined1 local_f8 [8];
  transaction<std::unique_lock<mock_mutex>_> t2;
  uint64_t original_size;
  Message local_b0;
  size_type local_a8;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar;
  unique_lock<mock_mutex> local_78;
  undefined1 local_68 [8];
  transaction<std::unique_lock<mock_mutex>_> t1;
  mock_mutex mutex;
  size_type sStack_28;
  uint align;
  size_t original_num_regions;
  file_base *file;
  region_container *regions;
  Transaction_RollbackAfterFillingRegion_Test *this_local;
  
  this_03 = &(this->super_Transaction).db_;
  psVar3 = pstore::database::storage(&this_03->super_database);
  this_00 = pstore::storage::regions(psVar3);
  psVar3 = pstore::database::storage(&this_03->super_database);
  pfVar4 = pstore::storage::file(psVar3);
  sStack_28 = std::
              vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
              ::size(this_00);
  t1.lock_._12_4_ = 1;
  std::unique_lock<mock_mutex>::unique_lock(&local_78,(mutex_type *)&t1.lock_.field_0xb);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_68,&this_03->super_database,&local_78)
  ;
  std::unique_lock<mock_mutex>::~unique_lock(&local_78);
  this_01 = (__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             *)std::
               vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
               ::back(this_00);
  this_02 = std::
            __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->(this_01);
  uVar5 = pstore::memory_mapper_base::end(this_02);
  uVar6 = pstore::database::size(&(this->super_Transaction).db_.super_database);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::transaction_base::allocate((transaction_base *)local_68,(uVar5 - uVar6) - 0x70,1);
  pstore::transaction_base::commit((transaction_base *)local_68);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_68);
  local_a8 = std::
             vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
             ::size(this_00);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_a0,"regions.size ()","original_num_regions",&local_a8,
             &stack0xffffffffffffffd8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pMVar7 = testing::Message::operator<<
                       (&local_b0,
                        (char (*) [55])"Expected the first allocate to fill the initial region");
    pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&original_size,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x177,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&original_size,pMVar7);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&original_size);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  t2.lock_._8_4_ = (*pfVar4->_vptr_file_base[9])();
  t2.lock_._12_4_ = extraout_var;
  std::unique_lock<mock_mutex>::unique_lock(&local_108,(mutex_type *)&t1.lock_.field_0xb);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_f8,
          &(this->super_Transaction).db_.super_database,&local_108);
  std::unique_lock<mock_mutex>::~unique_lock(&local_108);
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::transaction_base::allocate((transaction_base *)local_f8,4,1);
  pstore::transaction_base::rollback((transaction_base *)local_f8);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_f8);
  local_128 = std::
              vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
              ::size(this_00);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_120,"regions.size ()","original_num_regions",&local_128,
             &stack0xffffffffffffffd8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pMVar7 = testing::Message::operator<<
                       (&local_130,(char (*) [33])"Rollback did not reclaim regions");
    pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x180,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,pMVar7);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  iVar2 = (*pfVar4->_vptr_file_base[9])();
  local_150 = CONCAT44(extraout_var_00,iVar2);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_148,"file->size ()","original_size",&local_150,
             (unsigned_long *)&t2.lock_._M_owns);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pMVar7 = testing::Message::operator<<
                       (&local_158,(char (*) [47])"The file was not restored to its original size");
    pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x181,pcVar8);
    testing::internal::AssertHelper::operator=(&local_160,pMVar7);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  return;
}

Assistant:

TEST_F (Transaction, RollbackAfterFillingRegion) {
    pstore::storage::region_container const & regions = db_.storage ().regions ();
    pstore::file::file_base * const file = db_.storage ().file ();
    std::size_t const original_num_regions = regions.size ();
    constexpr auto align = 1U;

    mock_mutex mutex;
    using guard_type = std::unique_lock<mock_mutex>;

    {
        auto t1 = begin (db_, guard_type{mutex});
        t1.allocate (regions.back ()->end () - db_.size () - sizeof (pstore::trailer), align);
        t1.commit ();
    }
    EXPECT_EQ (regions.size (), original_num_regions)
        << "Expected the first allocate to fill the initial region";

    std::uint64_t const original_size = file->size ();
    {
        auto t2 = begin (db_, guard_type{mutex});
        t2.allocate (sizeof (int), align);
        t2.rollback ();
    }
    EXPECT_EQ (regions.size (), original_num_regions) << "Rollback did not reclaim regions";
    EXPECT_EQ (file->size (), original_size) << "The file was not restored to its original size";
}